

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

int __thiscall
QTableViewPrivate::widthHintForIndex
          (QTableViewPrivate *this,QModelIndex *index,int hint,QStyleOptionViewItem *option)

{
  QTableView *this_00;
  Data *pDVar1;
  bool bVar2;
  Representation RVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QEditorInfo *pQVar7;
  QSize QVar8;
  QSize QVar9;
  long *plVar10;
  Span *pSVar11;
  int i;
  int iVar12;
  long in_FS_OFFSET;
  QWidget *editor;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTableView **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  pQVar7 = QAbstractItemViewPrivate::editorForIndex(&this->super_QAbstractItemViewPrivate,index);
  pDVar1 = (pQVar7->widget).wp.d;
  RVar3.m_i = hint;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    editor = (QWidget *)0x0;
  }
  else {
    editor = (QWidget *)(pQVar7->widget).wp.value;
    if ((editor != (QWidget *)0x0) &&
       (bVar2 = QHash<QWidget_*,_QHashDummyValue>::contains
                          (&(this->super_QAbstractItemViewPrivate).persistent.q_hash,&editor), bVar2
       )) {
      RVar3.m_i = (**(code **)(*(long *)editor + 0x70))();
      if (RVar3.m_i <= hint) {
        RVar3.m_i = hint;
      }
      QVar8 = QWidget::minimumSize(editor);
      QVar9 = QWidget::maximumSize(editor);
      if (QVar9.wd.m_i.m_i < RVar3.m_i) {
        RVar3.m_i = QVar9.wd.m_i.m_i;
      }
      if (RVar3.m_i <= QVar8.wd.m_i.m_i) {
        RVar3.m_i = QVar8.wd.m_i.m_i;
      }
    }
  }
  plVar10 = (long *)(**(code **)(*(long *)&(this_00->super_QAbstractItemView).
                                           super_QAbstractScrollArea.super_QFrame.super_QWidget +
                                0x208))(this_00,index);
  iVar4 = (**(code **)(*plVar10 + 0x68))(plVar10,option,index);
  if (iVar4 < RVar3.m_i) {
    iVar4 = RVar3.m_i;
  }
  iVar12 = iVar4;
  if ((QSpanCollection *)
      (this->spans).spans.
      super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
      _M_node.super__List_node_base._M_next != &this->spans) {
    pSVar11 = QSpanCollection::spanAt(&this->spans,index->c,index->r);
    if (((pSVar11 != (Span *)0x0) && (pSVar11->m_left == index->c)) && (pSVar11->m_top == index->r))
    {
      iVar5 = logicalColumn(this,pSVar11->m_left);
      for (iVar12 = 1; iVar12 <= (pSVar11->m_right - pSVar11->m_left) + 1; iVar12 = iVar12 + 1) {
        iVar6 = visualColumn(this,iVar5 + iVar12);
        iVar6 = QTableView::columnWidth(this_00,iVar6);
        iVar4 = iVar4 - iVar6;
      }
    }
    iVar12 = hint;
    if (hint < iVar4) {
      iVar12 = iVar4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar12;
}

Assistant:

int QTableViewPrivate::widthHintForIndex(const QModelIndex &index, int hint, const QStyleOptionViewItem &option) const
{
    Q_Q(const QTableView);
    const int oldHint = hint;
    QWidget *editor = editorForIndex(index).widget.data();
    if (editor && persistent.contains(editor)) {
        hint = qMax(hint, editor->sizeHint().width());
        int min = editor->minimumSize().width();
        int max = editor->maximumSize().width();
        hint = qBound(min, hint, max);
    }
    hint = qMax(hint, q->itemDelegateForIndex(index)->sizeHint(option, index).width());

    if (hasSpans()) {
        auto span = spans.spanAt(index.column(), index.row());
        if (span && span->m_left == index.column() && span->m_top == index.row()) {
            // spans are screwed up when sections are moved
            const auto left = logicalColumn(span->m_left);
            for (int i = 1; i <= span->width(); ++i)
               hint -= q->columnWidth(visualColumn(left + i));
        }
        hint = std::max(hint, oldHint);
    }
    return hint;
}